

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O3

bool __thiscall ON_wString::FormatVargs(ON_wString *this,wchar_t *format,__va_list_tag *args)

{
  uint uVar1;
  uint uVar2;
  wchar_t *buffer;
  ON_wString temp;
  ON_wString OStack_38;
  
  uVar1 = FormatVargsOutputCount(format,args);
  if (0 < (int)uVar1) {
    ON_wString(&OStack_38);
    SetLength(&OStack_38,(ulong)uVar1);
    buffer = Array(&OStack_38);
    uVar2 = FormatVargsIntoBuffer(buffer,(ulong)uVar1 + 1,format,args);
    if (uVar2 == uVar1) {
      operator=(this,&OStack_38);
      ~ON_wString(&OStack_38);
      return true;
    }
    ~ON_wString(&OStack_38);
  }
  Destroy(this);
  Create(this);
  return uVar1 == 0;
}

Assistant:

bool ON_wString::FormatVargs(const wchar_t* format, va_list args)
{
  const int len_count = ON_wString::FormatVargsOutputCount(format, args);
  if (len_count > 0)
  {
    // temp is used because sometimes "this" is an argument as in:
    //   ON_String str = L"filename.ext";
    //   str.Format(L"C:\\%s",str);
    ON_wString temp;
    temp.SetLength(len_count);
    const int len_string = ON_wString::FormatVargsIntoBuffer(temp.Array(), size_t(len_count) + 1, format, args);
    if (len_string == len_count)
    {
      *this = temp;
      return true;
    }
  }
  Destroy();
  Create();
  return (0 == len_count);
}